

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::NamespaceScope::NamespaceScope
          (NamespaceScope *this,NamespaceScope *initialize,MemoryManager *manager)

{
  StackElem *pSVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  XMLCh *prefixToAdd;
  ulong uVar4;
  ulong uVar5;
  
  (this->super_XercesNamespaceResolver)._vptr_XercesNamespaceResolver =
       (_func_int **)&PTR_getNamespaceForPrefix_00407dd8;
  this->fEmptyNamespaceId = 0;
  this->fStackCapacity = 8;
  this->fStackTop = 0;
  XMLStringPool::XMLStringPool(&this->fPrefixPool,0x6d,manager);
  this->fStack = (StackElem **)0x0;
  this->fMemoryManager = manager;
  iVar2 = (*manager->_vptr_MemoryManager[3])(manager);
  this->fStack = (StackElem **)CONCAT44(extraout_var,iVar2);
  memset((StackElem **)CONCAT44(extraout_var,iVar2),0,(ulong)this->fStackCapacity << 3);
  if (initialize != (NamespaceScope *)0x0) {
    reset(this,initialize->fEmptyNamespaceId);
    uVar4 = (ulong)initialize->fStackTop;
    while ((int)uVar4 != 0) {
      uVar4 = (ulong)((int)uVar4 - 1);
      pSVar1 = initialize->fStack[uVar4];
      uVar3 = pSVar1->fMapCount;
      if (uVar3 != 0) {
        for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
          prefixToAdd = XMLStringPool::getValueForId
                                  (&initialize->fPrefixPool,pSVar1->fMap[uVar5].fPrefId);
          uVar3 = (**(this->super_XercesNamespaceResolver)._vptr_XercesNamespaceResolver)
                            (this,prefixToAdd);
          if (uVar3 == this->fEmptyNamespaceId) {
            addPrefix(this,prefixToAdd,pSVar1->fMap[uVar5].fURIId);
          }
          uVar3 = pSVar1->fMapCount;
        }
      }
    }
  }
  return;
}

Assistant:

NamespaceScope::NamespaceScope(const NamespaceScope* const initialize, MemoryManager* const manager /*= XMLPlatformUtils::fgMemoryManager*/) :
    fEmptyNamespaceId(0)
    , fStackCapacity(8)
    , fStackTop(0)
    , fPrefixPool(109, manager)
    , fStack(0)
    , fMemoryManager(manager)
{
    // Do an initial allocation of the stack and zero it out
    fStack = (StackElem**) fMemoryManager->allocate
    (
        fStackCapacity * sizeof(StackElem*)
    );//new StackElem*[fStackCapacity];
    memset(fStack, 0, fStackCapacity * sizeof(StackElem*));

    if(initialize)
    {
        reset(initialize->fEmptyNamespaceId);

        // copy the existing bindings
        for (unsigned int index = initialize->fStackTop; index > 0; index--)
        {
            // Get a convenience pointer to the current element
            StackElem* curRow = initialize->fStack[index-1];

            // If no prefixes mapped at this level, then go the next one
            if (!curRow->fMapCount)
                continue;

            for (unsigned int mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
            {
                // go from the id to the prefix
                const XMLCh* prefix = initialize->fPrefixPool.getValueForId(curRow->fMap[mapIndex].fPrefId);

                // if the prefix is not already known, add it
                if(getNamespaceForPrefix(prefix)==fEmptyNamespaceId)
                    addPrefix(prefix, curRow->fMap[mapIndex].fURIId);
            }
        }
    }
}